

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamFormatParser_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::SamFormatParser::ParseSamLine(SamFormatParser *this,string *line)

{
  __type _Var1;
  string restOfLine;
  string firstToken;
  
  if (4 < line->_M_string_length) {
    std::__cxx11::string::substr((ulong)&firstToken,(ulong)line);
    std::__cxx11::string::substr((ulong)&restOfLine,(ulong)line);
    _Var1 = std::operator==(&firstToken,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            Constants::SAM_HD_BEGIN_TOKEN_abi_cxx11_);
    if (_Var1) {
      ParseHDLine(this,&restOfLine);
    }
    else {
      _Var1 = std::operator==(&firstToken,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              Constants::SAM_SQ_BEGIN_TOKEN_abi_cxx11_);
      if (_Var1) {
        ParseSQLine(this,&restOfLine);
      }
      else {
        _Var1 = std::operator==(&firstToken,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )Constants::SAM_RG_BEGIN_TOKEN_abi_cxx11_);
        if (_Var1) {
          ParseRGLine(this,&restOfLine);
        }
        else {
          _Var1 = std::operator==(&firstToken,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)Constants::SAM_PG_BEGIN_TOKEN_abi_cxx11_);
          if (_Var1) {
            ParsePGLine(this,&restOfLine);
          }
          else {
            _Var1 = std::operator==(&firstToken,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)Constants::SAM_CO_BEGIN_TOKEN_abi_cxx11_);
            if (_Var1) {
              ParseCOLine(this,&restOfLine);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&restOfLine);
    std::__cxx11::string::~string((string *)&firstToken);
  }
  return;
}

Assistant:

void SamFormatParser::ParseSamLine(const std::string& line)
{

    // skip if line is not long enough to contain true values
    if (line.length() < 5) {
        return;
    }

    // determine token at beginning of line
    const std::string firstToken = line.substr(0, 3);
    const std::string restOfLine = line.substr(4);
    if (firstToken == Constants::SAM_HD_BEGIN_TOKEN) {
        ParseHDLine(restOfLine);
    } else if (firstToken == Constants::SAM_SQ_BEGIN_TOKEN) {
        ParseSQLine(restOfLine);
    } else if (firstToken == Constants::SAM_RG_BEGIN_TOKEN) {
        ParseRGLine(restOfLine);
    } else if (firstToken == Constants::SAM_PG_BEGIN_TOKEN) {
        ParsePGLine(restOfLine);
    } else if (firstToken == Constants::SAM_CO_BEGIN_TOKEN) {
        ParseCOLine(restOfLine);
    }
}